

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_parse_positive_int<long>(string *text,long *value_p)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pbVar1 = (byte *)(text->_M_dataplus)._M_p;
  pbVar2 = pbVar1 + text->_M_string_length;
  lVar3 = 0;
  while( true ) {
    if ((pbVar2 <= pbVar1) || ((byte)(*pbVar1 - 0x3a) < 0xf6)) goto LAB_002d161f;
    if (0xccccccccccccccc < lVar3) break;
    lVar3 = lVar3 * 10;
    uVar4 = (ulong)(*pbVar1 & 0xf);
    uVar5 = uVar4 ^ 0x7fffffffffffffff;
    if (lVar3 - uVar5 != 0 && (long)uVar5 <= lVar3) break;
    lVar3 = lVar3 + uVar4;
    pbVar1 = pbVar1 + 1;
  }
  lVar3 = 0x7fffffffffffffff;
LAB_002d161f:
  *value_p = lVar3;
  return pbVar2 <= pbVar1;
}

Assistant:

bool safe_parse_positive_int(std::string text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(vmax >= base);
  const IntType vmax_over_base = vmax / base;
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}